

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variable.cpp
# Opt level: O0

string * __thiscall
ninx::lexer::token::Variable::dump_abi_cxx11_(string *__return_storage_ptr__,Variable *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Variable *local_18;
  Variable *this_local;
  
  local_18 = this;
  this_local = (Variable *)__return_storage_ptr__;
  std::operator+(&local_38,"VARIABLE: \'",&this->name);
  std::operator+(__return_storage_ptr__,&local_38,"\'");
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::lexer::token::Variable::dump() const {
    return "VARIABLE: '" + this->name + "'";
}